

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall iu_Matcher_x_iutest_x_Optional_Test::Body(iu_Matcher_x_iutest_x_Optional_Test *this)

{
  optional<int> *v;
  optional<int> *v_00;
  optional<int> *v_01;
  optional<std::unique_ptr<int,_std::default_delete<int>_>_> *v_02;
  AssertionResult *in_R8;
  AssertionResult iutest_ar;
  string local_248;
  string local_228;
  AssertionResult local_208;
  iuCodeMessage local_1e0;
  undefined1 local_1b0 [16];
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [22];
  
  local_1e0.m_message._M_dataplus._M_p._0_4_ = 1;
  local_1b0._0_8_ = &PTR__OptionalMatcher_002277a8;
  local_198 = 0;
  local_190[0]._M_local_buf[0] = '\0';
  local_1b0._8_8_ = &local_1e0;
  local_1a0._M_p = (pointer)local_190;
  iutest::detail::OptionalMatcher<int>::operator()
            (&local_208,(OptionalMatcher<int> *)local_1b0,&opt1);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (local_208.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::PrintToString<std::optional<int>>(&local_228,(iutest *)&opt1,v);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_248,(detail *)local_228._M_dataplus._M_p,"Optional(1)",(char *)&local_208,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x355,(char *)CONCAT44(local_248._M_dataplus._M_p._4_4_,
                                       local_248._M_dataplus._M_p._0_4_));
    local_1e0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e0,(Fixed *)local_1b0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
  }
  std::__cxx11::string::~string((string *)&local_208);
  local_248._M_dataplus._M_p._0_4_ = 1;
  local_1e0.m_message._M_dataplus._M_p = (pointer)&PTR__IMatcher_00224340;
  local_1b0._0_8_ = &PTR__OptionalMatcher_00227828;
  local_198 = 0;
  local_190[0]._M_local_buf[0] = '\0';
  local_1e0.m_message._M_string_length = (size_type)&local_248;
  local_1b0._8_8_ = &local_1e0;
  local_1a0._M_p = (pointer)local_190;
  iutest::detail::OptionalMatcher<iutest::detail::EqMatcher<int>>::operator()
            (&local_208,(OptionalMatcher<iutest::detail::EqMatcher<int>> *)local_1b0,&opt1);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (local_208.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::PrintToString<std::optional<int>>(&local_228,(iutest *)&opt1,v_00);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_248,(detail *)local_228._M_dataplus._M_p,"Optional(Eq(1))",(char *)&local_208,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x356,(char *)CONCAT44(local_248._M_dataplus._M_p._4_4_,
                                       local_248._M_dataplus._M_p._0_4_));
    local_1e0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e0,(Fixed *)local_1b0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
  }
  std::__cxx11::string::~string((string *)&local_208);
  local_248._M_dataplus._M_p._0_4_ = 2;
  local_1e0.m_message._M_dataplus._M_p = (pointer)&PTR__IMatcher_002248c0;
  local_1b0._0_8_ = &PTR__OptionalMatcher_00227868;
  local_198 = 0;
  local_190[0]._M_local_buf[0] = '\0';
  local_1e0.m_message._M_string_length = (size_type)&local_248;
  local_1b0._8_8_ = &local_1e0;
  local_1a0._M_p = (pointer)local_190;
  iutest::detail::OptionalMatcher<iutest::detail::LtMatcher<int>>::operator()
            (&local_208,(OptionalMatcher<iutest::detail::LtMatcher<int>> *)local_1b0,&opt1);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (local_208.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::PrintToString<std::optional<int>>(&local_228,(iutest *)&opt1,v_01);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_248,(detail *)local_228._M_dataplus._M_p,"Optional(Lt(2))",(char *)&local_208,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x357,(char *)CONCAT44(local_248._M_dataplus._M_p._4_4_,
                                       local_248._M_dataplus._M_p._0_4_));
    local_1e0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e0,(Fixed *)local_1b0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
  }
  std::__cxx11::string::~string((string *)&local_208);
  local_1e0.m_message._M_dataplus._M_p = (pointer)&PTR__IMatcher_00223c68;
  local_1b0._0_8_ = &PTR__OptionalMatcher_002278a8;
  local_198 = 0;
  local_190[0]._M_local_buf[0] = '\0';
  local_1b0._8_8_ = &local_1e0;
  local_1a0._M_p = (pointer)local_190;
  iutest::detail::OptionalMatcher<iutest::detail::IsNullMatcher>::operator()
            (&local_208,(OptionalMatcher<iutest::detail::IsNullMatcher> *)local_1b0,&optnull);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (local_208.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::PrintToString<std::optional<std::unique_ptr<int,std::default_delete<int>>>>
              (&local_228,(iutest *)&optnull,v_02);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_248,(detail *)local_228._M_dataplus._M_p,"Optional(IsNull())",
               (char *)&local_208,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x359,(char *)CONCAT44(local_248._M_dataplus._M_p._4_4_,
                                       local_248._M_dataplus._M_p._0_4_));
    local_1e0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e0,(Fixed *)local_1b0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
  }
  std::__cxx11::string::~string((string *)&local_208);
  return;
}

Assistant:

IUTEST(Matcher, Optional)
{
    IUTEST_EXPECT_THAT(opt1, Optional(1));
    IUTEST_EXPECT_THAT(opt1, Optional(Eq(1)));
    IUTEST_EXPECT_THAT(opt1, Optional(Lt(2)));

    IUTEST_EXPECT_THAT(optnull, Optional(IsNull()));
}